

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

int32_t __thiscall
fasttext::Dictionary::getLine
          (Dictionary *this,istream *in,vector<int,_std::allocator<int>_> *words,minstd_rand *rng)

{
  char *pcVar1;
  pointer piVar2;
  iterator __position;
  bool bVar3;
  entry_type eVar4;
  int32_t iVar5;
  size_t sVar6;
  uint32_t h;
  int iVar7;
  int iVar8;
  Dictionary *this_00;
  double dVar9;
  string_view w;
  int32_t wid;
  string token;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>,_double>
  __aurng;
  int32_t local_5c;
  undefined1 local_58 [32];
  minstd_rand *local_38;
  
  local_58._0_8_ = local_58 + 0x10;
  local_58._8_8_ = 0;
  local_58[0x10] = '\0';
  this_00 = this;
  local_38 = rng;
  reset(this,in);
  piVar2 = (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar2;
  }
  iVar8 = 0;
  while (bVar3 = readWord(this_00,in,(string *)local_58), bVar3) {
    h = 0x811c9dc5;
    if (local_58._8_8_ != 0) {
      sVar6 = 0;
      do {
        pcVar1 = (char *)(local_58._0_8_ + sVar6);
        sVar6 = sVar6 + 1;
        h = ((int)*pcVar1 ^ h) * 0x1000193;
      } while (local_58._8_8_ != sVar6);
    }
    w._M_str = (char *)local_58._0_8_;
    w._M_len = local_58._8_8_;
    this_00 = this;
    iVar5 = find(this,w,h);
    local_5c = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[iVar5];
    if (-1 < local_5c) {
      this_00 = this;
      eVar4 = getType(this,local_5c);
      iVar5 = local_5c;
      if (eVar4 == word) {
        dVar9 = std::
                generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
                          (local_38);
        this_00 = this;
        bVar3 = discard(this,iVar5,(float)(dVar9 + 0.0));
        if (!bVar3) {
          __position._M_current =
               (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            this_00 = (Dictionary *)words;
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)words,__position,&local_5c);
          }
          else {
            *__position._M_current = local_5c;
            (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = __position._M_current + 1;
          }
        }
      }
      iVar7 = iVar8 + 1;
      bVar3 = 0x3ff < iVar8;
      iVar8 = iVar7;
      if ((bVar3) ||
         ((local_58._8_8_ == DAT_0014c470 &&
          ((local_58._8_8_ == 0 ||
           (this_00 = (Dictionary *)local_58._0_8_,
           iVar7 = bcmp((void *)local_58._0_8_,EOS_abi_cxx11_,local_58._8_8_), iVar7 == 0))))))
      break;
    }
  }
  if ((Dictionary *)local_58._0_8_ != (Dictionary *)(local_58 + 0x10)) {
    operator_delete((void *)local_58._0_8_,CONCAT71(local_58._17_7_,local_58[0x10]) + 1);
  }
  return iVar8;
}

Assistant:

int32_t Dictionary::getLine(
    std::istream& in,
    std::vector<int32_t>& words,
    std::minstd_rand& rng) const {
  std::uniform_real_distribution<> uniform(0, 1);
  std::string token;
  int32_t ntokens = 0;

  reset(in);
  words.clear();
  while (readWord(in, token)) {
    int32_t h = find(token);
    int32_t wid = word2int_[h];
    if (wid < 0) {
      continue;
    }

    ntokens++;
    if (getType(wid) == entry_type::word && !discard(wid, uniform(rng))) {
      words.push_back(wid);
    }
    if (ntokens > MAX_LINE_SIZE || token == EOS) {
      break;
    }
  }
  return ntokens;
}